

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O1

VP8StatusCode WebPIAppend(WebPIDecoder *idec,uint8_t *data,size_t data_size)

{
  size_t *psVar1;
  DecState DVar2;
  MemBufferMode MVar3;
  void *pvVar4;
  size_t sVar5;
  VP8StatusCode VVar6;
  VP8Decoder *dec;
  uint8_t *__dest;
  uint8_t *__src;
  ulong nmemb;
  size_t __n;
  uint8_t *puVar7;
  bool bVar8;
  
  VVar6 = VP8_STATUS_INVALID_PARAM;
  if (data != (uint8_t *)0x0 && idec != (WebPIDecoder *)0x0) {
    DVar2 = idec->state_;
    VVar6 = VP8_STATUS_BITSTREAM_ERROR;
    if (DVar2 != STATE_ERROR) {
      VVar6 = (uint)(DVar2 != STATE_DONE) * 5;
    }
    if (VVar6 == VP8_STATUS_SUSPENDED) {
      MVar3 = (idec->mem_).mode_;
      if (MVar3 != MEM_MODE_APPEND) {
        if (MVar3 != MEM_MODE_NONE) {
          return VP8_STATUS_INVALID_PARAM;
        }
        (idec->mem_).mode_ = MEM_MODE_APPEND;
      }
      pvVar4 = idec->dec_;
      bVar8 = true;
      if (((DVar2 != STATE_WEBP_HEADER) && (idec->is_lossless_ == 0)) &&
         (*(long *)((long)pvVar4 + 0xb98) != 0)) {
        bVar8 = *(int *)((long)pvVar4 + 0xba8) != 0;
      }
      puVar7 = (idec->mem_).buf_;
      if (puVar7 == (uint8_t *)0x0) {
        puVar7 = (uint8_t *)0x0;
      }
      else {
        puVar7 = puVar7 + (idec->mem_).start_;
      }
      __src = puVar7;
      if (!bVar8) {
        __src = *(uint8_t **)((long)pvVar4 + 0xb98);
      }
      VVar6 = VP8_STATUS_OUT_OF_MEMORY;
      if (data_size < 0xfffffff7) {
        sVar5 = (idec->mem_).end_;
        if ((idec->mem_).buf_size_ < sVar5 + data_size) {
          __n = (sVar5 - (idec->mem_).start_) + ((long)puVar7 - (long)__src);
          nmemb = data_size + __n + 0xfff & 0xfffffffffffff000;
          __dest = (uint8_t *)WebPSafeMalloc(nmemb,1);
          if (__dest == (uint8_t *)0x0) {
            return VP8_STATUS_OUT_OF_MEMORY;
          }
          if (__src != (uint8_t *)0x0) {
            memcpy(__dest,__src,__n);
          }
          WebPSafeFree((idec->mem_).buf_);
          (idec->mem_).buf_ = __dest;
          (idec->mem_).buf_size_ = nmemb;
          (idec->mem_).start_ = (long)puVar7 - (long)__src;
          (idec->mem_).end_ = __n;
        }
        memcpy((idec->mem_).buf_ + (idec->mem_).end_,data,data_size);
        psVar1 = &(idec->mem_).end_;
        *psVar1 = *psVar1 + data_size;
        DoRemap(idec,(ptrdiff_t)((idec->mem_).buf_ + ((idec->mem_).start_ - (long)puVar7)));
        VVar6 = IDecode(idec);
        return VVar6;
      }
    }
  }
  return VVar6;
}

Assistant:

VP8StatusCode WebPIAppend(WebPIDecoder* idec,
                          const uint8_t* data, size_t data_size) {
  VP8StatusCode status;
  if (idec == NULL || data == NULL) {
    return VP8_STATUS_INVALID_PARAM;
  }
  status = IDecCheckStatus(idec);
  if (status != VP8_STATUS_SUSPENDED) {
    return status;
  }
  // Check mixed calls between RemapMemBuffer and AppendToMemBuffer.
  if (!CheckMemBufferMode(&idec->mem_, MEM_MODE_APPEND)) {
    return VP8_STATUS_INVALID_PARAM;
  }
  // Append data to memory buffer
  if (!AppendToMemBuffer(idec, data, data_size)) {
    return VP8_STATUS_OUT_OF_MEMORY;
  }
  return IDecode(idec);
}